

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# allocator.cpp
# Opt level: O2

void __thiscall ncnn::PoolAllocator::fastFree(PoolAllocator *this,void *ptr)

{
  list<std::pair<unsigned_long,_void_*>,_std::allocator<std::pair<unsigned_long,_void_*>_>_>
  *this_00;
  _List_node_base *p_Var1;
  const_iterator __position;
  value_type local_28;
  
  pthread_mutex_lock((pthread_mutex_t *)&this->d->payouts_lock);
  this_00 = &this->d->payouts;
  __position._M_node = (_List_node_base *)this_00;
  do {
    __position._M_node = (__position._M_node)->_M_next;
    if (__position._M_node == (_List_node_base *)this_00) {
      pthread_mutex_unlock((pthread_mutex_t *)&this->d->payouts_lock);
      fprintf(_stderr,"FATAL ERROR! pool allocator get wild %p",ptr);
      fputc(10,_stderr);
      free(ptr);
      return;
    }
  } while (__position._M_node[1]._M_prev != (_List_node_base *)ptr);
  p_Var1 = __position._M_node[1]._M_next;
  std::__cxx11::
  list<std::pair<unsigned_long,_void_*>,_std::allocator<std::pair<unsigned_long,_void_*>_>_>::erase
            (this_00,__position);
  pthread_mutex_unlock((pthread_mutex_t *)&this->d->payouts_lock);
  pthread_mutex_lock((pthread_mutex_t *)this->d);
  local_28.first = (unsigned_long)p_Var1;
  local_28.second = ptr;
  std::__cxx11::
  list<std::pair<unsigned_long,_void_*>,_std::allocator<std::pair<unsigned_long,_void_*>_>_>::
  push_back(&this->d->budgets,&local_28);
  pthread_mutex_unlock((pthread_mutex_t *)this->d);
  return;
}

Assistant:

void PoolAllocator::fastFree(void* ptr)
{
    d->payouts_lock.lock();

    // return to budgets
    std::list<std::pair<size_t, void*> >::iterator it = d->payouts.begin();
    for (; it != d->payouts.end(); ++it)
    {
        if (it->second == ptr)
        {
            size_t size = it->first;

            d->payouts.erase(it);

            d->payouts_lock.unlock();

            d->budgets_lock.lock();

            d->budgets.push_back(std::make_pair(size, ptr));

            d->budgets_lock.unlock();

            return;
        }
    }

    d->payouts_lock.unlock();

    NCNN_LOGE("FATAL ERROR! pool allocator get wild %p", ptr);
    ncnn::fastFree(ptr);
}